

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int parse_path_key_expr(char *id,char **prefix,int *pref_len,char **name,int *nam_len,
                       int *parent_times)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17c,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (parent_times == (int *)0x0) {
    __assert_fail("parent_times",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17d,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (prefix != (char **)0x0) {
    *prefix = (char *)0x0;
  }
  if (pref_len != (int *)0x0) {
    *pref_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  iVar2 = *parent_times;
  if (iVar2 == 0) {
    iVar10 = strncmp(id,"current()",9);
    if (iVar10 != 0) {
      return 0;
    }
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    lVar4 = 0;
    while ((*(byte *)((long)puVar1 + (long)id[lVar4 + 9] * 2 + 1) & 0x20) != 0) {
      lVar4 = lVar4 + 1;
    }
    if (id[lVar4 + 9] == '/') {
      do {
        lVar8 = lVar4;
        lVar4 = lVar8 + 1;
      } while ((*(byte *)((long)puVar1 + (long)id[lVar8 + 10] * 2 + 1) & 0x20) != 0);
      if ((id[lVar8 + 10] == '.') && (id[lVar8 + 0xb] == '.')) {
        uVar9 = lVar8 + 0xc;
        while (cVar5 = id[uVar9], (*(byte *)((long)puVar1 + (long)cVar5 * 2 + 1) & 0x20) != 0) {
          uVar9 = uVar9 + 1;
        }
        id = id + uVar9;
        iVar10 = 1;
        goto LAB_0011d593;
      }
    }
    iVar2 = -9 - (int)lVar4;
  }
  else {
    cVar5 = *id;
    uVar9 = 0;
    iVar10 = 0;
LAB_0011d593:
    if (cVar5 == '/') {
      ppuVar3 = __ctype_b_loc();
      puVar1 = *ppuVar3;
      do {
        uVar7 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar7;
        lVar4 = (long)id[1];
        id = id + 1;
        pcVar6 = id;
        uVar11 = uVar7;
      } while ((*(byte *)((long)puVar1 + lVar4 * 2 + 1) & 0x20) != 0);
      while (((char)lVar4 == '.' && (pcVar6[1] == '.'))) {
        if (iVar2 != 0) goto LAB_0011d6e5;
        uVar11 = uVar11 + 2;
        pcVar6 = pcVar6 + 2;
        while ((*(byte *)((long)puVar1 + (long)*pcVar6 * 2 + 1) & 0x20) != 0) {
          uVar11 = uVar11 + 1;
          pcVar6 = pcVar6 + 1;
        }
        if (*pcVar6 != '/') {
          return -uVar11;
        }
        iVar10 = iVar10 + 1;
        do {
          uVar11 = uVar11 + 1;
          lVar4 = (long)pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while ((*(byte *)((long)puVar1 + lVar4 * 2 + 1) & 0x20) != 0);
      }
      id = pcVar6;
      uVar7 = uVar11;
      if (iVar2 == 0) {
        *parent_times = iVar10;
      }
LAB_0011d6e5:
      iVar2 = parse_node_identifier(id,prefix,pref_len,name,nam_len);
      if (iVar2 < 1) {
        iVar2 = iVar2 - uVar7;
      }
      else {
        iVar2 = uVar7 + iVar2;
      }
    }
    else {
      iVar2 = -(int)uVar9;
    }
  }
  return iVar2;
}

Assistant:

static int
parse_path_key_expr(const char *id, const char **prefix, int *pref_len, const char **name, int *nam_len,
                    int *parent_times)
{
    int parsed = 0, ret, par_times = 0;

    assert(id);
    assert(parent_times);
    if (prefix) {
        *prefix = NULL;
    }
    if (pref_len) {
        *pref_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }

    if (!*parent_times) {
        /* current-function-invocation *WSP "/" *WSP rel-path-keyexpr */
        if (strncmp(id, "current()", 9)) {
            return -parsed;
        }

        parsed += 9;
        id += 9;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* rel-path-keyexpr */
        if (strncmp(id, "..", 2)) {
            return -parsed;
        }
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    /* 1*(".." *WSP "/" *WSP) *(node-identifier *WSP "/" *WSP) node-identifier
     *
     * first parent reference with whitespaces already parsed
     */
    if (id[0] != '/') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    while (!strncmp(id, "..", 2) && !*parent_times) {
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (!*parent_times) {
        *parent_times = par_times;
    }

    /* all parent references must be parsed at this point */
    if ((ret = parse_node_identifier(id, prefix, pref_len, name, nam_len)) < 1) {
        return -parsed+ret;
    }

    parsed += ret;
    id += ret;

    return parsed;
}